

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

bool __thiscall
mocker::detail::InterferenceGraph::isAdjacent(InterferenceGraph *this,Node *u,Node *v)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  const_iterator cVar4;
  pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_> local_40;
  
  bVar3 = std::operator<(&((u->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->identifier,
                         &((v->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->identifier);
  if (bVar3) {
    peVar1 = (u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (v->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (v->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
    p_Var2 = (v->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    (v->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    (u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         p_Var2;
  }
  std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>::
  pair<std::shared_ptr<mocker::nasm::Register>_&,_std::shared_ptr<mocker::nasm::Register>_&,_true>
            (&local_40,u,v);
  cVar4 = std::
          _Hashtable<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Identity,_mocker::detail::InterferenceGraph::NodePairEqual,_mocker::detail::InterferenceGraph::NodePairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->edges)._M_h,&local_40);
  std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>::
  ~pair(&local_40);
  return cVar4.
         super__Node_iterator_base<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool InterferenceGraph::isAdjacent(Node u, Node v) const {
  if (u->getIdentifier() < v->getIdentifier())
    std::swap(u, v);
  return edges.find(std::make_pair(u, v)) != edges.end();
}